

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::half> *value)

{
  bool bVar1;
  undefined7 in_register_00000001;
  half v;
  storage_t<tinyusdz::value::half> local_12;
  
  local_12 = SUB72((uint7)in_register_00000001 >> 0x28,0);
  bVar1 = MaybeNone(this);
  if (bVar1) {
    value->has_value_ = false;
    bVar1 = true;
  }
  else {
    bVar1 = ReadBasicType(this,(half *)&local_12);
    if (bVar1) {
      if (value->has_value_ == true) {
        value->contained = local_12;
      }
      else {
        value->contained = local_12;
        value->has_value_ = true;
      }
    }
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::half> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::half v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}